

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void n_number_suite::n_number_1_exp_capital_exp_2(void)

{
  char input [7];
  reader reader;
  undefined4 local_174;
  view_type local_170;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"[1eE2]",7);
  local_170._M_len = strlen(local_160);
  local_170._M_str = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x44a,"void n_number_suite::n_number_1_exp_capital_exp_2()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x44c,"void n_number_suite::n_number_1_exp_capital_exp_2()",&local_170,&local_174);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void n_number_1_exp_capital_exp_2()
{
    const char input[] = "[1eE2]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}